

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O2

void anon_unknown.dwarf_61553::testMatrix(M44f *M)

{
  bool bVar1;
  ostream *poVar2;
  float (*pafVar3) [4];
  long lVar4;
  long lVar5;
  V3f t;
  V3f r;
  V3f h;
  V3f s;
  M44f D;
  M44f N;
  
  bVar1 = Imath_3_2::extractSHRT<float>(M,&s,&h,&r,&t,true);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to extractSHRT");
    std::endl<char,std::char_traits<char>>(poVar2);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractSHRT.cpp"
                  ,0xd4,"void (anonymous namespace)::testMatrix(const M44f)");
  }
  N.x[0][0] = 1.0;
  N.x[0][1] = 0.0;
  N.x[0][2] = 0.0;
  N.x[0][3] = 0.0;
  N.x[1][0] = 0.0;
  N.x[1][1] = 1.0;
  N.x[1][2] = 0.0;
  N.x[1][3] = 0.0;
  N.x[2][0] = 0.0;
  N.x[2][1] = 0.0;
  N.x[2][2] = 1.0;
  N.x[2][3] = 0.0;
  N.x[3][0] = 0.0;
  N.x[3][1] = 0.0;
  N.x[3][2] = 0.0;
  N.x[3][3] = 1.0;
  Imath_3_2::Matrix44<float>::translate<float>(&N,&t);
  Imath_3_2::Matrix44<float>::rotate<float>(&N,&r);
  Imath_3_2::Matrix44<float>::shear<float>(&N,&h);
  Imath_3_2::Matrix44<float>::scale<float>(&N,&s);
  pafVar3 = (float (*) [4])&D;
  Imath_3_2::Matrix44<float>::operator-(M,&N);
  lVar5 = 0;
  do {
    if (lVar5 == 4) {
      return;
    }
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      if (1e-05 < ABS((*(float (*) [4])*pafVar3)[lVar4])) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*pafVar3)[lVar4]);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar5);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar4);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar2 = Imath_3_2::operator<<(poVar2,M);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar2 = Imath_3_2::operator<<(poVar2,&N);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar2 = Imath_3_2::operator<<(poVar2,&D);
        std::endl<char,std::char_traits<char>>(poVar2);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractSHRT.cpp"
                      ,0xfa,"void (anonymous namespace)::testMatrix(const M44f)");
      }
    }
    lVar5 = lVar5 + 1;
    pafVar3 = pafVar3 + 1;
  } while( true );
}

Assistant:

void
testMatrix (const M44f M)
{
    //
    // Extract Euler angles from M, and convert the
    // Euler angles back to a matrix, N.
    //

    V3f s, h, r, t;

    if (!extractSHRT (M, s, h, r, t, true))
    {
        cout << "Unable to extractSHRT" << std::endl;
        assert (false);
    }

    M44f N;

    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.shear (h);
    N.scale (s);

    debug (("Re-scale: %f %f %f\n", s[0], s[1], s[2]));
    debug (("Re-shear: %f %f %f\n", h[0], h[1], h[2]));
    debug (("Re-rot  : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Re-trans: %f %f %f\n", t[0], t[1], t[2]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M44f D (M - N);

    for (int j = 0; j < 4; ++j)
    {
        for (int k = 0; k < 4; ++k)
        {
            if (abs (D[j][k]) > 0.00001)
            {
                cout << "unexpectedly large matrix to "
                        "euler angles conversion error: "
                     << D[j][k] << endl;

                cout << j << " " << k << endl;

                cout << "M\n" << M << endl;
                cout << "N\n" << N << endl;
                cout << "D\n" << D << endl;

                assert (false);
            }
        }
    }
}